

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  ConfigData *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Config_002517e0;
  TestSpec::~TestSpec((TestSpec *)in_RDI);
  clara::std::unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>::
  ~unique_ptr((unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_> *)in_RDI
             );
  ConfigData::~ConfigData(in_RDI);
  IConfig::~IConfig((IConfig *)0x16bb76);
  return;
}

Assistant:

virtual ~Config() = default;